

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O3

void __thiscall libebml::EbmlElement::EbmlElement(EbmlElement *this,EbmlElement *ElementToClone)

{
  uint64 uVar1;
  
  this->_vptr_EbmlElement = (_func_int **)&PTR__EbmlElement_001cd4c8;
  uVar1 = ElementToClone->DefaultSize;
  this->Size = ElementToClone->Size;
  this->DefaultSize = uVar1;
  this->SizeLength = ElementToClone->SizeLength;
  this->bSizeIsFinite = ElementToClone->bSizeIsFinite;
  uVar1 = ElementToClone->SizePosition;
  this->ElementPosition = ElementToClone->ElementPosition;
  this->SizePosition = uVar1;
  this->bValueIsSet = ElementToClone->bValueIsSet;
  this->DefaultIsSet = ElementToClone->DefaultIsSet;
  this->bLocked = ElementToClone->bLocked;
  return;
}

Assistant:

EbmlElement::EbmlElement(const EbmlElement & ElementToClone)
  :Size(ElementToClone.Size)
  ,DefaultSize(ElementToClone.DefaultSize)
  ,SizeLength(ElementToClone.SizeLength)
  ,bSizeIsFinite(ElementToClone.bSizeIsFinite)
  ,ElementPosition(ElementToClone.ElementPosition)
  ,SizePosition(ElementToClone.SizePosition)
  ,bValueIsSet(ElementToClone.bValueIsSet)
  ,DefaultIsSet(ElementToClone.DefaultIsSet)
  ,bLocked(ElementToClone.bLocked)
{
}